

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

LOs __thiscall Omega_h::invert_fan(Omega_h *this,LOs *a2b)

{
  int size_in;
  void *extraout_RDX;
  LOs LVar1;
  Write<int> local_c8;
  Write<int> local_b8;
  undefined1 local_a8 [8];
  type f;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Write<int> b2a;
  int nb;
  int na;
  LOs *a2b_local;
  ulong local_10;
  
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  b2a.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2) + -1;
  size_in = Read<int>::last(a2b);
  b2a.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Write<int>::Write((Write<int> *)local_50,size_in,-1,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Read<int>::Read((Read<int> *)local_a8,a2b);
  Write<int>::Write((Write<int> *)&f.a2b.write_.shared_alloc_.direct_ptr,(Write<int> *)local_50);
  parallel_for<Omega_h::invert_fan(Omega_h::Read<int>)::__0>
            (b2a.shared_alloc_.direct_ptr._4_4_,(type *)local_a8,"invert_fan");
  Write<int>::Write(&local_b8,(Write<int> *)local_50);
  fill_right(&local_b8);
  Write<int>::~Write(&local_b8);
  Write<int>::Write(&local_c8,(Write<int> *)local_50);
  Read<int>::Read((Read<int> *)this,&local_c8);
  Write<int>::~Write(&local_c8);
  invert_fan(Omega_h::Read<int>)::$_0::~__0((__0 *)local_a8);
  Write<int>::~Write((Write<int> *)local_50);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs invert_fan(LOs a2b) {
  auto na = a2b.size() - 1;
  auto nb = a2b.last();
  Write<LO> b2a(nb, -1);
  auto f = OMEGA_H_LAMBDA(LO a) {
    if (a2b[a] != a2b[a + 1]) b2a[a2b[a]] = a;
  };
  parallel_for(na, f, "invert_fan");
  fill_right(b2a);
  return b2a;
}